

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O0

void __thiscall cmSourceGroup::~cmSourceGroup(cmSourceGroup *this)

{
  cmSourceGroup *this_local;
  
  std::unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>::~unique_ptr
            (&this->Internal);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            (&this->SourceFiles);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->GroupFiles);
  cmsys::RegularExpression::~RegularExpression(&this->GroupRegex);
  std::__cxx11::string::~string((string *)&this->FullName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmSourceGroup::~cmSourceGroup() = default;